

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall ON_SubDEdgeChain::Vertex(ON_SubDEdgeChain *this,int vertex_index)

{
  int iVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDVertex *local_30;
  int edge_count;
  int vertex_index_local;
  ON_SubDEdgeChain *this_local;
  
  iVar1 = ON_SimpleArray<ON_SubDEdgePtr>::Count(&this->m_edge_chain);
  if (((vertex_index < 0) || (iVar1 < vertex_index)) || (iVar1 < 1)) {
    this_local = (ON_SubDEdgeChain *)0x0;
  }
  else {
    if (vertex_index == iVar1) {
      pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,iVar1 + -1);
      local_30 = ON_SubDEdgePtr::RelativeVertex(pOVar2,1);
    }
    else {
      pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,vertex_index);
      local_30 = ON_SubDEdgePtr::RelativeVertex(pOVar2,0);
    }
    this_local = (ON_SubDEdgeChain *)local_30;
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const ON_SubDVertex* ON_SubDEdgeChain::Vertex(int vertex_index) const
{
  const int edge_count = m_edge_chain.Count();
  if ( vertex_index >= 0 && vertex_index <= edge_count && edge_count > 0 )
  {
    return 
      (vertex_index == edge_count)
      ? m_edge_chain[edge_count - 1].RelativeVertex(1)
      : m_edge_chain[vertex_index].RelativeVertex(0);
  }
  return nullptr;
}